

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O1

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  long *plVar1;
  long lVar2;
  size_t __size;
  ogg_uint32_t *poVar3;
  ogg_uint32_t *poVar4;
  ogg_int32_t *poVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  size_t sVar25;
  int *sparsemap;
  undefined1 *__base;
  int aiStack_60 [2];
  long lStack_58;
  ogg_uint32_t *local_50;
  ulong local_48;
  int local_3c;
  size_t local_38;
  
  c->q_min = 0;
  c->q_delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (ogg_int32_t *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->used_entries = 0;
  *(undefined8 *)&c->binarypoint = 0;
  c->dim = 0;
  c->entries = 0;
  lVar8 = s->entries;
  iVar14 = 0;
  uVar23 = 0;
  if (0 < lVar8) {
    lVar12 = 0;
    uVar23 = 0;
    do {
      uVar23 = uVar23 + (0 < s->lengthlist[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar8 != lVar12);
  }
  c->entries = lVar8;
  sVar25 = (size_t)(int)uVar23;
  c->used_entries = sVar25;
  c->dim = s->dim;
  if (0 < (int)uVar23) {
    aiStack_60[0] = 0x11f924;
    aiStack_60[1] = 0;
    poVar3 = _make_words(s->lengthlist,lVar8,sVar25);
    lVar8 = -(sVar25 * 8 + 0xf & 0xfffffffffffffff0);
    __base = (undefined1 *)((long)&lStack_58 + lVar8);
    sparsemap = (int *)__base;
    if (poVar3 != (ogg_uint32_t *)0x0) {
      lVar12 = 0;
      do {
        uVar15 = *(uint *)((long)poVar3 + lVar12);
        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        uVar15 = (uVar15 & 0xf0f0f0f) << 4 | uVar15 >> 4 & 0xf0f0f0f;
        uVar15 = (uVar15 >> 2 & 0x33333333) + (uVar15 & 0x33333333) * 4;
        *(uint *)((long)poVar3 + lVar12) = (uVar15 >> 1 & 0x55555555) + (uVar15 & 0x55555555) * 2;
        *(long *)(__base + lVar12 * 2) = (long)poVar3 + lVar12;
        lVar12 = lVar12 + 4;
      } while (sVar25 * 4 - lVar12 != 0);
      local_50 = poVar3;
      local_38 = sVar25 * 4;
      *(undefined8 *)((long)aiStack_60 + lVar8) = 0x11f9cc;
      qsort(__base,sVar25,8,sort32a);
      __size = local_38;
      sparsemap = (int *)(__base + -(sVar25 * 4 + 0xf & 0xfffffffffffffff0));
      sparsemap[-2] = 0x11f9ed;
      sparsemap[-1] = 0;
      poVar4 = (ogg_uint32_t *)malloc(__size);
      poVar3 = local_50;
      c->codelist = poVar4;
      uVar10 = 1;
      if (1 < (int)uVar23) {
        uVar10 = (ulong)uVar23;
      }
      uVar13 = 0;
      do {
        sparsemap[(int)((ulong)(*(long *)(__base + uVar13 * 8) - (long)poVar3) >> 2)] = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      uVar13 = 0;
      do {
        poVar4[sparsemap[uVar13]] = poVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      sparsemap[-2] = 0x11fa3a;
      sparsemap[-1] = 0;
      free(poVar3);
      sparsemap[-2] = 0x11fa4c;
      sparsemap[-1] = 0;
      poVar5 = _book_unquantize(s,uVar23,sparsemap,&c->binarypoint);
      sVar25 = local_38;
      c->valuelist = poVar5;
      sparsemap[-2] = 0x11fa59;
      sparsemap[-1] = 0;
      piVar6 = (int *)malloc(sVar25);
      c->dec_index = piVar6;
      lVar8 = s->entries;
      uVar10 = 0;
      if (lVar8 < 1) {
        sVar25 = 0;
      }
      else {
        plVar1 = s->lengthlist;
        lVar12 = 0;
        iVar14 = 0;
        do {
          if (0 < plVar1[lVar12]) {
            lVar16 = (long)iVar14;
            iVar14 = iVar14 + 1;
            piVar6[sparsemap[lVar16]] = (int)lVar12;
          }
          lVar12 = lVar12 + 1;
        } while (lVar8 != lVar12);
        sVar25 = (size_t)iVar14;
      }
      sparsemap[-2] = 0x11fa9a;
      sparsemap[-1] = 0;
      pcVar7 = (char *)malloc(sVar25);
      c->dec_codelengths = pcVar7;
      if (0 < s->entries) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          if (0 < s->lengthlist[lVar8]) {
            iVar14 = (int)uVar10;
            uVar10 = (ulong)(iVar14 + 1);
            c->dec_codelengths[sparsemap[iVar14]] = (char)s->lengthlist[lVar8];
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < s->entries);
      }
      uVar23 = (uint)c->used_entries;
      uVar15 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar15 = (uVar15 ^ 0xffffffe0) + 0x21;
      if (uVar23 == 0) {
        uVar15 = 0;
      }
      uVar23 = 0xc;
      if ((int)uVar15 < 0xc) {
        uVar23 = uVar15;
      }
      local_3c = 5;
      if (8 < uVar15) {
        local_3c = uVar23 - 4;
      }
      c->dec_firsttablen = local_3c;
      uVar23 = 1 << ((byte)local_3c & 0x1f);
      sparsemap[-2] = 0x11fb18;
      sparsemap[-1] = 0;
      poVar3 = (ogg_uint32_t *)calloc((ulong)uVar23,4);
      c->dec_firsttable = poVar3;
      c->dec_maxlength = 0;
      if (0 < (int)uVar10) {
        pcVar7 = c->dec_codelengths;
        iVar14 = c->dec_firsttablen;
        local_38 = CONCAT44(local_38._4_4_,iVar14);
        iVar17 = c->dec_maxlength;
        uVar13 = 0;
        do {
          iVar9 = (int)pcVar7[uVar13];
          if (iVar17 < iVar9) {
            c->dec_maxlength = iVar9;
            iVar17 = iVar9;
          }
          if (pcVar7[uVar13] <= iVar14) {
            iVar9 = c->dec_firsttablen;
            iVar11 = (int)pcVar7[uVar13];
            if (iVar9 - iVar11 != 0x1f) {
              uVar15 = c->codelist[uVar13];
              uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                       uVar15 << 0x18;
              uVar15 = (uVar15 & 0xf0f0f0f) << 4 | uVar15 >> 4 & 0xf0f0f0f;
              uVar15 = (uVar15 >> 2 & 0x33333333) + (uVar15 & 0x33333333) * 4;
              iVar24 = 0;
              do {
                poVar3[iVar24 << ((byte)iVar11 & 0x1f) |
                       (uVar15 >> 1 & 0x55555555) + (uVar15 & 0x55555555) * 2] = (int)uVar13 + 1;
                iVar24 = iVar24 + 1;
                iVar11 = (int)pcVar7[uVar13];
              } while (iVar24 < 1 << ((char)iVar9 - pcVar7[uVar13] & 0x1fU));
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar10);
      }
      iVar14 = 0x20 - c->dec_firsttablen;
      lVar12 = (long)(int)uVar10;
      uVar15 = 0;
      uVar13 = 0;
      local_38 = CONCAT44(local_38._4_4_,iVar14);
      lVar8 = 0;
      do {
        uVar22 = uVar15 << ((byte)iVar14 & 0x1f);
        uVar18 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18
        ;
        uVar18 = (uVar18 & 0xf0f0f0f) << 4 | uVar18 >> 4 & 0xf0f0f0f;
        uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333) * 4;
        uVar18 = (uVar18 >> 1 & 0x55555555) + (uVar18 & 0x55555555) * 2;
        lVar16 = lVar8;
        if (poVar3[uVar18] == 0) {
          lVar20 = uVar13 + 1;
          if ((long)(uVar13 + 1) <= lVar12) {
            lVar20 = lVar12;
          }
          uVar21 = uVar13 - 1;
          do {
            uVar13 = lVar20 - 1;
            if ((1 - lVar20) + uVar21 == -1) break;
            uVar13 = uVar21 + 1;
            lVar2 = uVar21 + 2;
            uVar21 = uVar13;
          } while (c->codelist[lVar2] <= uVar22);
          if (lVar8 < lVar12) {
            do {
              lVar16 = lVar8;
              if (uVar22 < (c->codelist[lVar8] &
                           (uint)(0xfffffffeL << (0x1fU - (char)local_3c & 0x3f)))) break;
              lVar8 = lVar8 + 1;
              lVar16 = lVar12;
            } while (lVar12 != lVar8);
          }
          uVar19 = lVar12 - lVar16;
          uVar21 = 0x7fff;
          if (uVar13 < 0x7fff) {
            uVar21 = uVar13;
          }
          if (0x7ffe < uVar19) {
            uVar19 = 0x7fff;
          }
          poVar3[uVar18] = (uint)uVar19 | (int)uVar21 << 0xf | 0x80000000;
        }
        uVar15 = uVar15 + 1;
        lVar8 = lVar16;
      } while (uVar15 != uVar23);
      local_48 = uVar10;
      if (local_50 != (ogg_uint32_t *)0x0) {
        return 0;
      }
    }
    sparsemap[-2] = 0x11fd43;
    sparsemap[-1] = 0;
    vorbis_book_clear(c);
    iVar14 = -1;
  }
  return iVar14;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;
  memset(c,0,sizeof(*c));
  
  /* count actually used entries */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.  
       
       First, we collapse the likely sparse codebook down only to
       actually represented values/words.  This collapsing needs to be
       indexed as map-valueless books are used to encode original entry
       positions as integers.
       
       Second, we reorder all vectors, including the entry index above,
       by sorted bitreversed codeword to allow treeless decode. */
    
    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=(ogg_uint32_t **)alloca(sizeof(*codep)*n);
    
    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=(int *)alloca(n*sizeof(*sortindex));
    c->codelist=(ogg_uint32_t *)_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);
    
    
    
    c->valuelist=_book_unquantize(s,n,sortindex,&c->binarypoint);
    c->dec_index=(int *)_ogg_malloc(n*sizeof(*c->dec_index));
    
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_index[sortindex[n++]]=i;
    
    c->dec_codelengths=(char *)_ogg_malloc(n*sizeof(*c->dec_codelengths));
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
    
    c->dec_firsttablen=_ilog(c->used_entries)-4; /* this is magic */
    if(c->dec_firsttablen<5)c->dec_firsttablen=5;
    if(c->dec_firsttablen>8)c->dec_firsttablen=8;
    
    tabn=1<<c->dec_firsttablen;
    c->dec_firsttable=(ogg_uint32_t *)_ogg_calloc(tabn,sizeof(*c->dec_firsttable));
    c->dec_maxlength=0;
    
    for(i=0;i<n;i++){
      if(c->dec_maxlength<c->dec_codelengths[i])
	c->dec_maxlength=c->dec_codelengths[i];
      if(c->dec_codelengths[i]<=c->dec_firsttablen){
	ogg_uint32_t orig=bitreverse(c->codelist[i]);
	for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
	  c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
      }
    }
    
    /* now fill in 'unused' entries in the firsttable with hi/lo search
       hints for the non-direct-hits */
    {
      ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
      long lo=0,hi=0;
      
      for(i=0;i<tabn;i++){
	ogg_uint32_t word=i<<(32-c->dec_firsttablen);
	if(c->dec_firsttable[bitreverse(word)]==0){
	  while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
	  while(    hi<n && word>=(c->codelist[hi]&mask))hi++;
	  
	  /* we only actually have 15 bits per hint to play with here.
	     In order to overflow gracefully (nothing breaks, efficiency
	     just drops), encode as the difference from the extremes. */
	  {
	    unsigned long loval=lo;
	    unsigned long hival=n-hi;
	    
	    if(loval>0x7fff)loval=0x7fff;
	    if(hival>0x7fff)hival=0x7fff;
	    c->dec_firsttable[bitreverse(word)]=
	      0x80000000UL | (loval<<15) | hival;
	  }
	}
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}